

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

void __thiscall OpenSSLWrapper::SslConnection::SSLSetAcceptState(SslConnection *this)

{
  std::mutex::lock(&this->m_mxSsl);
  SSL_set_accept_state((SSL *)this->m_ssl);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxSsl);
  return;
}

Assistant:

void SslConnection::SSLSetAcceptState()
    {
        lock_guard<mutex> lk(m_mxSsl);
        SSL_set_accept_state(m_ssl);
    }